

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::generateMeasureUnitOption
               (MeasureUnit *measureUnit,UnicodeString *sb,UErrorCode *param_3)

{
  char *pcVar1;
  undefined4 srcLength;
  UnicodeString local_58;
  
  pcVar1 = MeasureUnit::getType(measureUnit);
  UnicodeString::UnicodeString(&local_58,pcVar1,-1,kInvariant);
  srcLength = local_58.fUnion.fFields.fLength;
  if (-1 < local_58.fUnion.fStackFields.fLengthAndFlags) {
    srcLength = (int)local_58.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(sb,&local_58,0,srcLength);
  UnicodeString::~UnicodeString(&local_58);
  local_58.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2d;
  UnicodeString::doAppend(sb,(UChar *)&local_58,0,1);
  pcVar1 = MeasureUnit::getSubtype(measureUnit);
  UnicodeString::UnicodeString(&local_58,pcVar1,-1,kInvariant);
  if (-1 < local_58.fUnion.fStackFields.fLengthAndFlags) {
    local_58.fUnion.fFields.fLength = (int)local_58.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(sb,&local_58,0,local_58.fUnion.fFields.fLength);
  UnicodeString::~UnicodeString(&local_58);
  return;
}

Assistant:

void blueprint_helpers::generateMeasureUnitOption(const MeasureUnit& measureUnit, UnicodeString& sb,
                                                  UErrorCode&) {
    // Need to do char <-> UChar conversion...
    sb.append(UnicodeString(measureUnit.getType(), -1, US_INV));
    sb.append(u'-');
    sb.append(UnicodeString(measureUnit.getSubtype(), -1, US_INV));
}